

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O0

void initialize_proxy_list(char **proxies_str_list,int count,download_status *status)

{
  char *__s;
  size_t sVar1;
  iterator local_80;
  const_iterator local_78 [3];
  allocator local_59;
  undefined1 local_58 [8];
  proxy proxy_to_insert;
  int i;
  download_status *status_local;
  int count_local;
  char **proxies_str_list_local;
  
  for (proxy_to_insert.speed._4_4_ = 0; proxy_to_insert.speed._4_4_ < count;
      proxy_to_insert.speed._4_4_ = proxy_to_insert.speed._4_4_ + 1) {
    __s = proxies_str_list[proxy_to_insert.speed._4_4_];
    sVar1 = strlen(__s);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_58,__s,sVar1,&local_59);
    proxy_to_insert._24_4_ = proxy_to_insert.speed._4_4_;
    proxy_to_insert.index = -1;
    proxy_to_insert._36_4_ = 0xffffffff;
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_80._M_node =
         (_List_node_base *)
         std::__cxx11::list<proxy,_std::allocator<proxy>_>::end(&status->globalProxyList);
    std::_List_const_iterator<proxy>::_List_const_iterator(local_78,&local_80);
    std::__cxx11::list<proxy,_std::allocator<proxy>_>::insert
              (&status->globalProxyList,local_78[0],(value_type *)local_58);
    proxy::~proxy((proxy *)local_58);
  }
  return;
}

Assistant:

void initialize_proxy_list(char **proxies_str_list, int count, download_status *status) {
    for (int i = 0; i < count; i++) {
        proxy proxy_to_insert = {string(proxies_str_list[i],strlen(proxies_str_list[i])), i};
        status->globalProxyList.insert(status->globalProxyList.end(), proxy_to_insert);
    }
}